

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::replacementIsNewer(CompatibilityChecker *this)

{
  Fault f;
  Fault local_18;
  
  if (this->compatibility == OLDER) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[144]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x29f,FAILED,(char *)0x0,
               "\"Schema node contains some changes that are upgrades and some \" \"that are downgrades.  All changes must be in the same direction for compatibility.\""
               ,(char (*) [144])
                "Schema node contains some changes that are upgrades and some that are downgrades.  All changes must be in the same direction for compatibility."
              );
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_18);
  }
  else if (this->compatibility == EQUIVALENT) {
    this->compatibility = NEWER;
  }
  return;
}

Assistant:

void replacementIsNewer() {
    switch (compatibility) {
      case EQUIVALENT:
        compatibility = NEWER;
        break;
      case OLDER:
        FAIL_VALIDATE_SCHEMA("Schema node contains some changes that are upgrades and some "
            "that are downgrades.  All changes must be in the same direction for compatibility.");
        break;
      case NEWER:
        break;
      case INCOMPATIBLE:
        break;
    }
  }